

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileCollider.cpp
# Opt level: O0

int __thiscall
solitaire::colliders::StockPileCollider::getCoveredCardsCount(StockPileCollider *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint *puVar3;
  size_type sVar4;
  Cards *cards;
  optional<unsigned_int> selectedCardIndex;
  StockPileCollider *this_local;
  
  selectedCardIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)this;
  iVar2 = (*(this->stockPile->super_Archiver)._vptr_Archiver[7])();
  cards = (Cards *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(this->stockPile->super_Archiver)._vptr_Archiver[6])();
  bVar1 = std::optional::operator_cast_to_bool((optional *)&cards);
  if (bVar1) {
    sVar4 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::size
                      ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                       CONCAT44(extraout_var_00,iVar2));
    puVar3 = std::optional<unsigned_int>::value((optional<unsigned_int> *)&cards);
    this_local._4_4_ = (int)sVar4 - (*puVar3 + 1);
  }
  else {
    sVar4 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::size
                      ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                       CONCAT44(extraout_var_00,iVar2));
    this_local._4_4_ = (int)sVar4;
  }
  return this_local._4_4_;
}

Assistant:

int StockPileCollider::getCoveredCardsCount() const {
    const auto selectedCardIndex = stockPile.getSelectedCardIndex();
    const auto& cards = stockPile.getCards();

    if (selectedCardIndex)
        return cards.size() - (selectedCardIndex.value() + 1);
    return cards.size();
}